

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

Token * __thiscall llvm::yaml::Scanner::getNext(Token *__return_storage_ptr__,Scanner *this)

{
  bool bVar1;
  Token *pTVar2;
  Scanner *this_local;
  Token *Ret;
  
  pTVar2 = peekNext(this);
  Token::Token(__return_storage_ptr__,pTVar2);
  bVar1 = AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
          ::empty(&this->TokenQueue);
  if (!bVar1) {
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::pop_front(&this->TokenQueue);
  }
  bVar1 = AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
          ::empty(&this->TokenQueue);
  if (bVar1) {
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::resetAlloc(&this->TokenQueue);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Scanner::getNext() {
  Token Ret = peekNext();
  // TokenQueue can be empty if there was an error getting the next token.
  if (!TokenQueue.empty())
    TokenQueue.pop_front();

  // There cannot be any referenced Token's if the TokenQueue is empty. So do a
  // quick deallocation of them all.
  if (TokenQueue.empty())
    TokenQueue.resetAlloc();

  return Ret;
}